

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O3

void sd_offset_update<sparse_parameters>
               (sparse_parameters *weights,features *fs,uint64_t offset,float update,
               float regularization)

{
  long lVar1;
  float *pfVar2;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var3;
  ulong uVar4;
  uint64_t index;
  ulong local_58;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  ulong local_40;
  float *local_38;
  
  pfVar2 = (fs->values)._begin;
  if ((fs->values)._end != pfVar2) {
    uVar4 = 0;
    local_50 = update;
    local_4c = regularization;
    do {
      local_44 = pfVar2[uVar4];
      local_58 = (fs->indicies)._begin[uVar4] & weights->_weight_mask;
      _Var3._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)weights,&local_58);
      if (_Var3._M_cur == (__node_type *)0x0) {
        local_38 = calloc_or_throw<float>(1L << ((byte)weights->_stride_shift & 0x3f));
        local_40 = local_58;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,float*>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)weights,&local_40);
        _Var3._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)weights,&local_58);
        if (weights->fun != (_func_void_weight_ptr_void_ptr *)0x0) {
          (*weights->fun)(*(weight **)((long)_Var3._M_cur + 0x10),weights->default_data);
        }
      }
      local_48 = *(float *)(*(long *)((long)&((_Var3._M_cur)->
                                             super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                             ).
                                             super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                             ._M_storage._M_storage + 8) + offset * 4) * local_4c;
      local_58 = (fs->indicies)._begin[uVar4] & weights->_weight_mask;
      _Var3._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)weights,&local_58);
      if (_Var3._M_cur == (__node_type *)0x0) {
        local_38 = calloc_or_throw<float>(1L << ((byte)weights->_stride_shift & 0x3f));
        local_40 = local_58;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,float*>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)weights,&local_40);
        _Var3._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)weights,&local_58);
        if (weights->fun != (_func_void_weight_ptr_void_ptr *)0x0) {
          (*weights->fun)(*(weight **)((long)_Var3._M_cur + 0x10),weights->default_data);
        }
      }
      lVar1 = *(long *)((long)&((_Var3._M_cur)->
                               super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                               ._M_storage._M_storage + 8);
      *(float *)(lVar1 + offset * 4) =
           (local_44 * local_50 - local_48) + *(float *)(lVar1 + offset * 4);
      uVar4 = uVar4 + 1;
      pfVar2 = (fs->values)._begin;
    } while (uVar4 < (ulong)((long)(fs->values)._end - (long)pfVar2 >> 2));
  }
  return;
}

Assistant:

void sd_offset_update(T& weights, features& fs, uint64_t offset, float update, float regularization)
{
  for (size_t i = 0; i < fs.size(); i++)
    (&weights[fs.indicies[i]])[offset] += update * fs.values[i] - regularization * (&weights[fs.indicies[i]])[offset];
}